

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void al_get_window_position(ALLEGRO_DISPLAY *display,int *x,int *y)

{
  _func_void_ALLEGRO_DISPLAY_ptr_int_ptr_int_ptr *UNRECOVERED_JUMPTABLE;
  
  if (((display != (ALLEGRO_DISPLAY *)0x0) && (display->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = display->vt->get_window_position,
     UNRECOVERED_JUMPTABLE != (_func_void_ALLEGRO_DISPLAY_ptr_int_ptr_int_ptr *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(display,x,y);
    return;
  }
  *y = -1;
  *x = -1;
  return;
}

Assistant:

void al_get_window_position(ALLEGRO_DISPLAY *display, int *x, int *y)
{
   ASSERT(x);
   ASSERT(y);

   if (display && display->vt && display->vt->get_window_position) {
      display->vt->get_window_position(display, x, y);
   }
   else {
      *x = *y = -1;
   }
}